

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

void tree_sitter_gdscript_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  byte bVar1;
  undefined4 *puVar2;
  int *piVar3;
  uint *puVar4;
  long lVar5;
  void *pvVar6;
  uint uVar7;
  size_t __size;
  ulong uVar8;
  
  **(undefined4 **)((long)payload + 8) = 0;
  puVar2 = *payload;
  *puVar2 = 0;
  if (puVar2[1] == 0) {
    pvVar6 = realloc(*(void **)(puVar2 + 2),0x20);
    if (pvVar6 == (void *)0x0) {
      __assert_fail("tmp != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                    ,0x1d3,
                    "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                   );
    }
    piVar3 = *payload;
    *(void **)(piVar3 + 2) = pvVar6;
    uVar7 = 0x10;
    if (0x10 < (uint)(*piVar3 * 2)) {
      uVar7 = *piVar3 * 2;
    }
    piVar3[1] = uVar7;
  }
  puVar4 = *payload;
  uVar7 = *puVar4;
  *puVar4 = uVar7 + 1;
  *(undefined2 *)(*(long *)(puVar4 + 2) + (ulong)uVar7 * 2) = 0;
  if (length != 0) {
    bVar1 = *buffer;
    uVar8 = (ulong)bVar1;
    if (uVar8 == 0) {
      uVar8 = 1;
    }
    else {
      if (*(uint *)(*(long *)((long)payload + 8) + 4) < (uint)bVar1) {
        pvVar6 = realloc(*(void **)(*(long *)((long)payload + 8) + 8),uVar8);
        if (pvVar6 == (void *)0x0) {
          __assert_fail("tmp != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                        ,0x1da,
                        "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                       );
        }
        lVar5 = *(long *)((long)payload + 8);
        *(void **)(lVar5 + 8) = pvVar6;
        *(uint *)(lVar5 + 4) = (uint)bVar1;
      }
      puVar4 = *(uint **)((long)payload + 8);
      *puVar4 = (uint)bVar1;
      memcpy(*(void **)(puVar4 + 2),buffer + 1,uVar8);
      uVar8 = uVar8 + 1;
    }
    if ((uint)uVar8 < length) {
      do {
        piVar3 = *payload;
        if (piVar3[1] == *piVar3) {
          uVar7 = *piVar3 * 2;
          __size = (ulong)uVar7 * 2;
          if (uVar7 < 0x10) {
            __size = 0x20;
          }
          pvVar6 = realloc(*(void **)(piVar3 + 2),__size);
          if (pvVar6 == (void *)0x0) {
            __assert_fail("tmp != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                          ,0x1e1,
                          "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                         );
          }
          piVar3 = *payload;
          *(void **)(piVar3 + 2) = pvVar6;
          uVar7 = *piVar3 * 2;
          if (uVar7 < 0x11) {
            uVar7 = 0x10;
          }
          piVar3[1] = uVar7;
        }
        bVar1 = buffer[uVar8];
        puVar4 = *payload;
        uVar7 = *puVar4;
        *puVar4 = uVar7 + 1;
        *(ushort *)(*(long *)(puVar4 + 2) + (ulong)uVar7 * 2) = (ushort)bVar1;
        uVar8 = uVar8 + 1;
      } while (length != uVar8);
    }
    if (uVar8 != length) {
      __assert_fail("size == length",
                    "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                    ,0x1e4,
                    "void tree_sitter_gdscript_external_scanner_deserialize(void *, const char *, unsigned int)"
                   );
    }
  }
  return;
}

Assistant:

void tree_sitter_gdscript_external_scanner_deserialize(void *payload,
                                                       const char *buffer,
                                                       unsigned length) {
    Scanner *scanner = (Scanner *)payload;

    VEC_CLEAR(scanner->delimiters);
    VEC_CLEAR(scanner->indents);
    VEC_PUSH(scanner->indents, 0);

    if (length > 0) {
        size_t size = 0;

        size_t delimiter_count = (uint8_t)buffer[size++];
        if (delimiter_count > 0) {
            VEC_GROW(scanner->delimiters, delimiter_count);
            scanner->delimiters->len = delimiter_count;
            memcpy(scanner->delimiters->data, &buffer[size], delimiter_count);
            size += delimiter_count;
        }

        for (; size < length; size++) {
            VEC_PUSH(scanner->indents, (unsigned char)buffer[size]);
        }

        assert(size == length);
    }
}